

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemeReference.cpp
# Opt level: O0

void __thiscall
references::scheme::environment::environment
          (environment *this,cells *parms,cells *args,environment *outer)

{
  bool bVar1;
  reference pcVar2;
  pointer pcVar3;
  mapped_type *this_00;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_48;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_40;
  __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
  local_38;
  cellit p;
  cellit a;
  environment *outer_local;
  cells *args_local;
  cells *parms_local;
  environment *this_local;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
  ::map(&this->env_);
  this->outer_ = outer;
  p._M_current = (cell *)std::
                         vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>
                         ::begin(args);
  local_38._M_current =
       (cell *)std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
               begin(parms);
  while( true ) {
    local_40._M_current =
         (cell *)std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>::
                 end(parms);
    bVar1 = __gnu_cxx::operator!=(&local_38,&local_40);
    if (!bVar1) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
               ::operator++(&p,0);
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
             ::operator*(&local_48);
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
             ::operator->(&local_38);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_references::scheme::cell>_>_>
              ::operator[](&this->env_,&pcVar3->val);
    cell::operator=(this_00,pcVar2);
    __gnu_cxx::
    __normal_iterator<const_references::scheme::cell_*,_std::vector<references::scheme::cell,_std::allocator<references::scheme::cell>_>_>
    ::operator++(&local_38);
  }
  return;
}

Assistant:

environment(const cells & parms, const cells & args, environment * outer)
		: outer_(outer)
	{
		cellit a = args.begin();
		for (cellit p = parms.begin(); p != parms.end(); ++p)
			env_[p->val] = *a++;
	}